

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecretKey.cpp
# Opt level: O0

PublicKey * jbcoin::derivePublicKey(PublicKey *__return_storage_ptr__,KeyType type,SecretKey *sk)

{
  int iVar1;
  secp256k1_context *psVar2;
  uint8_t *puVar3;
  allocator local_159;
  string local_158;
  Slice local_138;
  undefined1 local_128;
  uchar auStack_127 [7];
  uchar buf [33];
  Slice local_f8;
  allocator local_e1;
  string local_e0;
  size_t local_c0;
  size_t len;
  uchar pubkey [33];
  allocator local_81;
  string local_80;
  undefined1 local_60 [8];
  secp256k1_pubkey pubkey_imp;
  SecretKey *sk_local;
  KeyType type_local;
  
  pubkey_imp.data._56_8_ = sk;
  if (type == secp256k1) {
    psVar2 = secp256k1Context<void>();
    puVar3 = SecretKey::data((SecretKey *)pubkey_imp.data._56_8_);
    iVar1 = secp256k1_ec_pubkey_create(psVar2,(secp256k1_pubkey *)local_60,puVar3);
    if (iVar1 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_80,"derivePublicKey: secp256k1_ec_pubkey_create failed",&local_81)
      ;
      LogicError(&local_80);
    }
    local_c0 = 0x21;
    psVar2 = secp256k1Context<void>();
    iVar1 = secp256k1_ec_pubkey_serialize
                      (psVar2,(uchar *)&len,&local_c0,(secp256k1_pubkey *)local_60,0x102);
    if (iVar1 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_e0,"derivePublicKey: secp256k1_ec_pubkey_serialize failed",
                 &local_e1);
      LogicError(&local_e0);
    }
    Slice::Slice(&local_f8,&len,local_c0);
    PublicKey::PublicKey(__return_storage_ptr__,&local_f8);
  }
  else {
    if (type != ed25519) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_158,"derivePublicKey: bad key type",&local_159);
      LogicError(&local_158);
    }
    local_128 = 0xed;
    puVar3 = SecretKey::data(sk);
    ed25519_publickey(puVar3,auStack_127);
    Slice::Slice(&local_138,&local_128,0x21);
    PublicKey::PublicKey(__return_storage_ptr__,&local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

PublicKey
derivePublicKey (KeyType type, SecretKey const& sk)
{
    switch(type)
    {
    case KeyType::secp256k1:
    {
        secp256k1_pubkey pubkey_imp;
        if(secp256k1_ec_pubkey_create(
                secp256k1Context(),
                &pubkey_imp,
                reinterpret_cast<unsigned char const*>(
                    sk.data())) != 1)
            LogicError("derivePublicKey: secp256k1_ec_pubkey_create failed");

        unsigned char pubkey[33];
        size_t len = sizeof(pubkey);
        if(secp256k1_ec_pubkey_serialize(
                secp256k1Context(),
                pubkey,
                &len,
                &pubkey_imp,
                SECP256K1_EC_COMPRESSED) != 1)
            LogicError("derivePublicKey: secp256k1_ec_pubkey_serialize failed");

        return PublicKey{Slice{pubkey,
            static_cast<std::size_t>(len)}};
    }
    case KeyType::ed25519:
    {
        unsigned char buf[33];
        buf[0] = 0xED;
        ed25519_publickey(sk.data(), &buf[1]);
        return PublicKey(Slice{ buf, sizeof(buf) });
    }
    default:
        LogicError("derivePublicKey: bad key type");
    };
}